

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateDirectFieldStore(Lowerer *this,Instr *instrStFld,PropertySymOpnd *propertySymOpnd)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  Opnd *this_00;
  undefined4 *puVar4;
  RegOpnd *baseOpnd;
  IndirOpnd *opndDst;
  MemRefOpnd *pMVar5;
  
  func = instrStFld->m_func;
  this_00 = LoadSlotArrayWithCachedLocalType(this,instrStFld,propertySymOpnd);
  uVar3 = IR::PropertySymOpnd::GetSlotIndex(propertySymOpnd);
  if (uVar3 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cb3,"(index != (uint16)-1)","index != (uint16)-1");
    if (!bVar2) goto LAB_0056b599;
    *puVar4 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if (bVar2) {
    baseOpnd = IR::Opnd::AsRegOpnd(this_00);
    opndDst = IR::IndirOpnd::New(baseOpnd,(uint)uVar3 << 3,TyInt64,func,false);
    LowererMD::GenerateWriteBarrierAssign(&this->m_lowererMD,opndDst,instrStFld->m_src1,instrStFld);
    return;
  }
  bVar2 = IR::Opnd::IsMemRefOpnd(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cbd,"(opndSlotArray->IsMemRefOpnd())","opndSlotArray->IsMemRefOpnd()");
    if (!bVar2) {
LAB_0056b599:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pMVar5 = IR::Opnd::AsMemRefOpnd(this_00);
  pMVar5 = IR::MemRefOpnd::New((void *)((ulong)uVar3 * 8 + pMVar5->m_memLoc),TyInt64,func,
                               AddrOpndKindDynamicMisc);
  LowererMD::GenerateWriteBarrierAssign(&this->m_lowererMD,pMVar5,instrStFld->m_src1,instrStFld);
  return;
}

Assistant:

void
Lowerer::GenerateDirectFieldStore(IR::Instr* instrStFld, IR::PropertySymOpnd* propertySymOpnd)
{
    Func* func = instrStFld->m_func;

    IR::Opnd *opndSlotArray = this->LoadSlotArrayWithCachedLocalType(instrStFld, propertySymOpnd);

    // Store the value to the slot, getting the slot index from the cache.
    uint16 index = propertySymOpnd->GetSlotIndex();
    AssertOrFailFast(index != (uint16)-1);

#if defined(RECYCLER_WRITE_BARRIER_JIT) && (defined(_M_IX86) || defined(_M_AMD64))
    if (opndSlotArray->IsRegOpnd())
    {
        IR::IndirOpnd * opndDst = IR::IndirOpnd::New(opndSlotArray->AsRegOpnd(), index * sizeof(Js::Var), TyMachReg, func);
        this->GetLowererMD()->GenerateWriteBarrierAssign(opndDst, instrStFld->GetSrc1(), instrStFld);
    }
    else
    {
        Assert(opndSlotArray->IsMemRefOpnd());
        IR::MemRefOpnd * opndDst = IR::MemRefOpnd::New((char*)opndSlotArray->AsMemRefOpnd()->GetMemLoc() + (index * sizeof(Js::Var)), TyMachReg, func);
        this->GetLowererMD()->GenerateWriteBarrierAssign(opndDst, instrStFld->GetSrc1(), instrStFld);
    }
#else
    IR::Opnd *opnd;

    if (opndSlotArray->IsRegOpnd())
    {
        opnd = IR::IndirOpnd::New(opndSlotArray->AsRegOpnd(), index * sizeof(Js::Var), TyMachReg, func);
    }
    else
    {
        opnd = IR::MemRefOpnd::New((char*)opndSlotArray->AsMemRefOpnd()->GetMemLoc() + (index * sizeof(Js::Var)), TyMachReg, func);
    }

    this->InsertMove(opnd, instrStFld->GetSrc1(), instrStFld);
#endif
}